

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunPeepholeOptimizations(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  uint uVar1;
  VmValueType VVar2;
  VmValue **ppVVar3;
  bool bVar4;
  VmInstructionType cmd;
  VmConstant *pVVar5;
  TypeBase *pTVar6;
  VmConstant *pVVar7;
  VmValue *pVVar8;
  VmValue *pVVar9;
  uint uVar10;
  char *__function;
  int iVar11;
  long lVar12;
  long lVar13;
  VmInstruction *pVVar14;
  SynBase *source;
  Allocator *allocator;
  VmConstant *totalOffset;
  VmConstant *fourth;
  InplaceStr local_40;
  
  if ((value == (VmValue *)0x0) || (pVVar8 = value, value->typeID != 4)) {
    pVVar8 = (VmValue *)0x0;
  }
  if (pVVar8 != (VmValue *)0x0) {
    pVVar8 = (VmValue *)pVVar8[1].source;
    while (pVVar8 != (VmValue *)0x0) {
      pVVar9 = (VmValue *)pVVar8[1].comment.begin;
      RunPeepholeOptimizations(ctx,module,pVVar8);
      pVVar8 = pVVar9;
    }
    return;
  }
  if ((value == (VmValue *)0x0) || (pVVar8 = value, value->typeID != 3)) {
    pVVar8 = (VmValue *)0x0;
  }
  if (pVVar8 != (VmValue *)0x0) {
    pVVar8 = (VmValue *)pVVar8[1].comment.end;
    while (pVVar8 != (VmValue *)0x0) {
      pVVar9 = pVVar8[1].users.little[0];
      RunPeepholeOptimizations(ctx,module,pVVar8);
      pVVar8 = pVVar9;
    }
    return;
  }
  if ((value == (VmValue *)0x0) || (value->typeID != 2)) {
    value = (VmValue *)0x0;
  }
  if ((VmInstruction *)value == (VmInstruction *)0x0) {
    return;
  }
  switch(((VmInstruction *)value)->cmd) {
  case VM_INST_LOAD_BYTE:
  case VM_INST_LOAD_SHORT:
  case VM_INST_LOAD_INT:
  case VM_INST_LOAD_FLOAT:
  case VM_INST_LOAD_DOUBLE:
  case VM_INST_LOAD_LONG:
  case VM_INST_LOAD_STRUCT:
    uVar10 = (((VmInstruction *)value)->arguments).count;
    if (uVar10 != 0) {
      ppVVar3 = (((VmInstruction *)value)->arguments).data;
      pVVar14 = (VmInstruction *)*ppVVar3;
      if ((pVVar14 == (VmInstruction *)0x0) || ((pVVar14->super_VmValue).typeID != 2)) {
        pVVar14 = (VmInstruction *)0x0;
      }
      if (pVVar14 == (VmInstruction *)0x0) {
        return;
      }
      if (uVar10 != 1) {
        pVVar5 = (VmConstant *)ppVVar3[1];
        if ((pVVar5 == (VmConstant *)0x0) || ((pVVar5->super_VmValue).typeID != 1)) {
          pVVar5 = (VmConstant *)0x0;
        }
        local_40.begin = (char *)0x0;
        pVVar5 = (VmConstant *)
                 anon_unknown.dwarf_233176::TryGetMemberAccessPointerAndOffset
                           (ctx,pVVar14,pVVar5,(VmConstant **)&local_40);
        if (pVVar5 == (VmConstant *)0x0) {
          return;
        }
        cmd = ((VmInstruction *)value)->cmd;
        pVVar7 = (VmConstant *)local_40.begin;
LAB_00287c00:
        pVVar8 = (VmValue *)0x0;
        pVVar9 = (VmValue *)0x0;
        fourth = (VmConstant *)0x0;
LAB_00287ca7:
        anon_unknown.dwarf_233176::ChangeInstructionTo
                  (module,(VmInstruction *)value,cmd,&pVVar5->super_VmValue,&pVVar7->super_VmValue,
                   pVVar9,&fourth->super_VmValue,pVVar8,&module->peepholeOptimizations);
switchD_00287b70_caseD_7:
        return;
      }
    }
    break;
  case VM_INST_LOAD_IMMEDIATE:
  case VM_INST_DOUBLE_TO_INT:
  case VM_INST_DOUBLE_TO_LONG:
  case VM_INST_DOUBLE_TO_FLOAT:
  case VM_INST_INT_TO_DOUBLE:
  case VM_INST_LONG_TO_DOUBLE:
  case VM_INST_INT_TO_LONG:
  case VM_INST_LONG_TO_INT:
  case VM_INST_INDEX:
  case VM_INST_FUNCTION_ADDRESS:
  case VM_INST_TYPE_ID:
  case VM_INST_SET_RANGE:
  case VM_INST_JUMP:
  case VM_INST_RETURN:
  case VM_INST_YIELD:
  case VM_INST_DIV:
  case VM_INST_POW:
  case VM_INST_MOD:
  case VM_INST_SHL:
  case VM_INST_SHR:
  case VM_INST_BIT_AND:
  case VM_INST_BIT_OR:
  case VM_INST_BIT_XOR:
  case VM_INST_ADD_LOAD:
  case VM_INST_SUB_LOAD:
  case VM_INST_MUL_LOAD:
  case VM_INST_DIV_LOAD:
  case VM_INST_POW_LOAD:
  case VM_INST_MOD_LOAD:
  case VM_INST_LESS_LOAD:
  case VM_INST_GREATER_LOAD:
  case VM_INST_LESS_EQUAL_LOAD:
  case VM_INST_GREATER_EQUAL_LOAD:
  case VM_INST_EQUAL_LOAD:
  case VM_INST_NOT_EQUAL_LOAD:
  case VM_INST_SHL_LOAD:
  case VM_INST_SHR_LOAD:
  case VM_INST_BIT_AND_LOAD:
  case VM_INST_BIT_OR_LOAD:
  case VM_INST_BIT_XOR_LOAD:
  case VM_INST_NEG:
  case VM_INST_BIT_NOT:
  case VM_INST_LOG_NOT:
    goto switchD_00287b70_caseD_7;
  case VM_INST_STORE_BYTE:
  case VM_INST_STORE_SHORT:
  case VM_INST_STORE_INT:
  case VM_INST_STORE_FLOAT:
  case VM_INST_STORE_DOUBLE:
  case VM_INST_STORE_LONG:
  case VM_INST_STORE_STRUCT:
    uVar10 = (((VmInstruction *)value)->arguments).count;
    if (uVar10 != 0) {
      ppVVar3 = (((VmInstruction *)value)->arguments).data;
      pVVar14 = (VmInstruction *)*ppVVar3;
      if ((pVVar14 == (VmInstruction *)0x0) || ((pVVar14->super_VmValue).typeID != 2)) {
        pVVar14 = (VmInstruction *)0x0;
      }
      if (pVVar14 == (VmInstruction *)0x0) {
        return;
      }
      if (uVar10 != 1) {
        pVVar5 = (VmConstant *)ppVVar3[1];
        if ((pVVar5 == (VmConstant *)0x0) || ((pVVar5->super_VmValue).typeID != 1)) {
          pVVar5 = (VmConstant *)0x0;
        }
        local_40.begin = (char *)0x0;
        pVVar5 = (VmConstant *)
                 anon_unknown.dwarf_233176::TryGetMemberAccessPointerAndOffset
                           (ctx,pVVar14,pVVar5,(VmConstant **)&local_40);
        if (pVVar5 == (VmConstant *)0x0) {
          return;
        }
        if (2 < (((VmInstruction *)value)->arguments).count) {
          cmd = ((VmInstruction *)value)->cmd;
          pVVar9 = (((VmInstruction *)value)->arguments).data[2];
          fourth = (VmConstant *)0x0;
          pVVar8 = (VmValue *)0x0;
          pVVar7 = (VmConstant *)local_40.begin;
          goto LAB_00287ca7;
        }
      }
    }
    break;
  case VM_INST_INDEX_UNSIZED:
    uVar10 = (((VmInstruction *)value)->arguments).count;
    if (1 < uVar10) {
      ppVVar3 = (((VmInstruction *)value)->arguments).data;
      pVVar8 = ppVVar3[1];
      if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 2)) {
        pVVar8 = (VmValue *)0x0;
      }
      if (pVVar8 == (VmValue *)0x0) {
        return;
      }
      if (*(int *)&pVVar8[1]._vptr_VmValue != 0x4a) {
        return;
      }
      if (VM_TYPE_INT < pVVar8[1].type.type) {
        pVVar5 = (VmConstant *)(*(undefined8 **)&pVVar8[1].typeID)[1];
        if (pVVar5 == (VmConstant *)0x0) {
          return;
        }
        if ((pVVar5->super_VmValue).typeID != 1) {
          return;
        }
        if (uVar10 != 2) {
          pVVar9 = (VmValue *)**(undefined8 **)&pVVar8[1].typeID;
          fourth = (VmConstant *)ppVVar3[2];
          pVVar8 = (VmValue *)0x0;
          cmd = VM_INST_INDEX;
          pVVar7 = (VmConstant *)*ppVVar3;
          goto LAB_00287ca7;
        }
      }
    }
    break;
  case VM_INST_MEM_COPY:
    uVar10 = (((VmInstruction *)value)->arguments).count;
    if (uVar10 != 0) {
      ppVVar3 = (((VmInstruction *)value)->arguments).data;
      pVVar14 = (VmInstruction *)*ppVVar3;
      if ((pVVar14 == (VmInstruction *)0x0) || ((pVVar14->super_VmValue).typeID != 2)) {
        pVVar14 = (VmInstruction *)0x0;
      }
      if (pVVar14 != (VmInstruction *)0x0) {
        if (uVar10 == 1) break;
        pVVar5 = (VmConstant *)ppVVar3[1];
        if ((pVVar5 == (VmConstant *)0x0) || ((pVVar5->super_VmValue).typeID != 1)) {
          pVVar5 = (VmConstant *)0x0;
        }
        local_40.begin = (char *)0x0;
        pVVar8 = anon_unknown.dwarf_233176::TryGetMemberAccessPointerAndOffset
                           (ctx,pVVar14,pVVar5,(VmConstant **)&local_40);
        if (pVVar8 != (VmValue *)0x0) {
          uVar10 = (((VmInstruction *)value)->arguments).count;
          if (((uVar10 < 3) || (uVar10 == 3)) || (uVar10 < 5)) break;
          ppVVar3 = (((VmInstruction *)value)->arguments).data;
          anon_unknown.dwarf_233176::ChangeInstructionTo
                    (module,(VmInstruction *)value,((VmInstruction *)value)->cmd,pVVar8,
                     (VmValue *)local_40.begin,ppVVar3[2],ppVVar3[3],ppVVar3[4],
                     &module->peepholeOptimizations);
        }
      }
      uVar10 = (((VmInstruction *)value)->arguments).count;
      if (2 < uVar10) {
        ppVVar3 = (((VmInstruction *)value)->arguments).data;
        pVVar14 = (VmInstruction *)ppVVar3[2];
        if ((pVVar14 == (VmInstruction *)0x0) || ((pVVar14->super_VmValue).typeID != 2)) {
          pVVar14 = (VmInstruction *)0x0;
        }
        if (pVVar14 == (VmInstruction *)0x0) {
          return;
        }
        if (uVar10 != 3) {
          pVVar5 = (VmConstant *)ppVVar3[3];
          if ((pVVar5 == (VmConstant *)0x0) || ((pVVar5->super_VmValue).typeID != 1)) {
            pVVar5 = (VmConstant *)0x0;
          }
          local_40.begin = (char *)0x0;
          pVVar9 = anon_unknown.dwarf_233176::TryGetMemberAccessPointerAndOffset
                             (ctx,pVVar14,pVVar5,(VmConstant **)&local_40);
          if (pVVar9 == (VmValue *)0x0) {
            return;
          }
          uVar10 = (((VmInstruction *)value)->arguments).count;
          if (((uVar10 != 0) && (uVar10 != 1)) && (4 < uVar10)) {
            cmd = ((VmInstruction *)value)->cmd;
            ppVVar3 = (((VmInstruction *)value)->arguments).data;
            pVVar5 = (VmConstant *)*ppVVar3;
            pVVar8 = ppVVar3[4];
            pVVar7 = (VmConstant *)ppVVar3[1];
            fourth = (VmConstant *)local_40.begin;
            goto LAB_00287ca7;
          }
        }
      }
    }
    break;
  case VM_INST_JUMP_Z:
    if ((((VmInstruction *)value)->arguments).count != 0) {
      pVVar8 = *(((VmInstruction *)value)->arguments).data;
      if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 2)) {
        pVVar8 = (VmValue *)0x0;
      }
      if (pVVar8 == (VmValue *)0x0) {
        return;
      }
      if (*(int *)&pVVar8[1]._vptr_VmValue == 0x2c) {
        VVar2 = pVVar8[1].type.type;
        if (VVar2 != VM_TYPE_VOID) {
          pVVar9 = (VmValue *)**(long **)&pVVar8[1].typeID;
          if ((pVVar9->type).type != VM_TYPE_INT) {
            return;
          }
          if ((pVVar9->type).size != 4) {
            return;
          }
          if (VVar2 != VM_TYPE_INT) {
            lVar12 = (*(long **)&pVVar8[1].typeID)[1];
            if (*(int *)(lVar12 + 0x10) != 1) {
              return;
            }
            iVar11 = *(int *)(lVar12 + 0x14);
joined_r0x002883a6:
            if (iVar11 != 4) {
              return;
            }
            bVar4 = IsConstantZero(pVVar9);
            VVar2 = pVVar8[1].type.type;
            if (bVar4) {
              if (((VM_TYPE_INT < VVar2) &&
                  (uVar10 = (((VmInstruction *)value)->arguments).count, 1 < uVar10)) &&
                 (uVar10 != 2)) {
                pVVar5 = *(VmConstant **)(*(long *)&pVVar8[1].typeID + 8);
LAB_00288930:
                ppVVar3 = (((VmInstruction *)value)->arguments).data;
                pVVar9 = ppVVar3[2];
                pVVar8 = (VmValue *)0x0;
                cmd = VM_INST_JUMP_NZ;
                pVVar7 = (VmConstant *)ppVVar3[1];
                fourth = (VmConstant *)0x0;
                goto LAB_00287ca7;
              }
            }
            else if (VM_TYPE_INT < VVar2) {
              bVar4 = IsConstantZero(*(VmValue **)(*(long *)&pVVar8[1].typeID + 8));
              if (!bVar4) {
                return;
              }
              if (((pVVar8[1].type.type != VM_TYPE_VOID) &&
                  (uVar10 = (((VmInstruction *)value)->arguments).count, 1 < uVar10)) &&
                 (uVar10 != 2)) {
                pVVar5 = (VmConstant *)**(undefined8 **)&pVVar8[1].typeID;
                goto LAB_00288930;
              }
            }
          }
        }
      }
      else {
        if (*(int *)&pVVar8[1]._vptr_VmValue != 0x2d) {
          return;
        }
        VVar2 = pVVar8[1].type.type;
        if (VVar2 != VM_TYPE_VOID) {
          pVVar9 = (VmValue *)**(long **)&pVVar8[1].typeID;
          if ((pVVar9->type).type != VM_TYPE_INT) {
            return;
          }
          if ((pVVar9->type).size != 4) {
            return;
          }
          if (VVar2 != VM_TYPE_INT) {
            lVar12 = (*(long **)&pVVar8[1].typeID)[1];
            if (*(int *)(lVar12 + 0x10) != 1) {
              return;
            }
            iVar11 = *(int *)(lVar12 + 0x14);
joined_r0x00288713:
            if (iVar11 != 4) {
              return;
            }
            bVar4 = IsConstantZero(pVVar9);
            VVar2 = pVVar8[1].type.type;
            if (bVar4) {
              if (((VM_TYPE_INT < VVar2) &&
                  (uVar10 = (((VmInstruction *)value)->arguments).count, 1 < uVar10)) &&
                 (uVar10 != 2)) {
                pVVar5 = *(VmConstant **)(*(long *)&pVVar8[1].typeID + 8);
LAB_002889a4:
                ppVVar3 = (((VmInstruction *)value)->arguments).data;
                pVVar9 = ppVVar3[2];
                pVVar8 = (VmValue *)0x0;
                cmd = VM_INST_JUMP_Z;
                pVVar7 = (VmConstant *)ppVVar3[1];
                fourth = (VmConstant *)0x0;
                goto LAB_00287ca7;
              }
            }
            else if (VM_TYPE_INT < VVar2) {
              bVar4 = IsConstantZero(*(VmValue **)(*(long *)&pVVar8[1].typeID + 8));
              if (!bVar4) {
                return;
              }
              if (((pVVar8[1].type.type != VM_TYPE_VOID) &&
                  (uVar10 = (((VmInstruction *)value)->arguments).count, 1 < uVar10)) &&
                 (uVar10 != 2)) {
                pVVar5 = (VmConstant *)**(undefined8 **)&pVVar8[1].typeID;
                goto LAB_002889a4;
              }
            }
          }
        }
      }
    }
    break;
  case VM_INST_JUMP_NZ:
    if ((((VmInstruction *)value)->arguments).count != 0) {
      pVVar8 = *(((VmInstruction *)value)->arguments).data;
      if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 2)) {
        pVVar8 = (VmValue *)0x0;
      }
      if (pVVar8 == (VmValue *)0x0) {
        return;
      }
      if (*(int *)&pVVar8[1]._vptr_VmValue == 0x2c) {
        VVar2 = pVVar8[1].type.type;
        if (VVar2 != VM_TYPE_VOID) {
          pVVar9 = (VmValue *)**(long **)&pVVar8[1].typeID;
          if ((pVVar9->type).type != VM_TYPE_INT) {
            return;
          }
          if ((pVVar9->type).size != 4) {
            return;
          }
          if (VVar2 != VM_TYPE_INT) {
            lVar12 = (*(long **)&pVVar8[1].typeID)[1];
            if (*(int *)(lVar12 + 0x10) != 1) {
              return;
            }
            iVar11 = *(int *)(lVar12 + 0x14);
            goto joined_r0x00288713;
          }
        }
      }
      else {
        if (*(int *)&pVVar8[1]._vptr_VmValue != 0x2d) {
          return;
        }
        VVar2 = pVVar8[1].type.type;
        if (VVar2 != VM_TYPE_VOID) {
          pVVar9 = (VmValue *)**(long **)&pVVar8[1].typeID;
          if ((pVVar9->type).type != VM_TYPE_INT) {
            return;
          }
          if ((pVVar9->type).size != 4) {
            return;
          }
          if (VVar2 != VM_TYPE_INT) {
            lVar12 = (*(long **)&pVVar8[1].typeID)[1];
            if (*(int *)(lVar12 + 0x10) != 1) {
              return;
            }
            iVar11 = *(int *)(lVar12 + 0x14);
            goto joined_r0x002883a6;
          }
        }
      }
    }
    break;
  case VM_INST_CALL:
    uVar10 = (((VmInstruction *)value)->arguments).count;
    if (uVar10 != 0) {
      ppVVar3 = (((VmInstruction *)value)->arguments).data;
      if (((*ppVVar3)->type).type == VM_TYPE_FUNCTION_REF) {
        return;
      }
      if (uVar10 != 1) {
        pVVar8 = ppVVar3[1];
        if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 4)) {
          pVVar8 = (VmValue *)0x0;
        }
        if (pVVar8 == (VmValue *)0x0) {
          __assert_fail("function",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1184,
                        "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)")
          ;
        }
        iVar11 = *(int *)((long)pVVar8[1]._vptr_VmValue + 0x44);
        if (iVar11 == 0xc) {
          if ((ctx->functions).count < 0xd) goto LAB_00288a14;
          local_40.begin = "double";
          local_40.end = "";
          bVar4 = InplaceStr::operator==(&(ctx->functions).data[0xc]->name->name,&local_40);
          if (!bVar4) {
            __assert_fail("ctx.functions[function->function->functionIndex]->name->name == InplaceStr(\"double\")"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x119a,
                          "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                         );
          }
          if (3 < (((VmInstruction *)value)->arguments).count) {
            pVVar8 = (((VmInstruction *)value)->arguments).data[3];
            if (((pVVar8->type).type != VM_TYPE_DOUBLE) || ((pVVar8->type).size != 8)) {
              __assert_fail("inst->arguments[3]->type == VmType::Double",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x119b,
                            "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                           );
            }
            goto LAB_00288864;
          }
        }
        else if (iVar11 == 10) {
          if ((ctx->functions).count < 0xb) goto LAB_00288a14;
          local_40.begin = "long";
          local_40.end = "";
          bVar4 = InplaceStr::operator==(&(ctx->functions).data[10]->name->name,&local_40);
          if (!bVar4) {
            __assert_fail("ctx.functions[function->function->functionIndex]->name->name == InplaceStr(\"long\")"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1191,
                          "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                         );
          }
          if (3 < (((VmInstruction *)value)->arguments).count) {
            pVVar8 = (((VmInstruction *)value)->arguments).data[3];
            if (((pVVar8->type).type != VM_TYPE_LONG) || ((pVVar8->type).size != 8)) {
              __assert_fail("inst->arguments[3]->type == VmType::Long",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1192,
                            "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                           );
            }
            goto LAB_00288864;
          }
        }
        else {
          if (iVar11 != 9) {
            return;
          }
          if ((ctx->functions).count < 10) {
LAB_00288a14:
            __function = 
            "T &SmallArray<FunctionData *, 128>::operator[](unsigned int) [T = FunctionData *, N = 128]"
            ;
            goto LAB_002889eb;
          }
          local_40.begin = "int";
          local_40.end = "";
          bVar4 = InplaceStr::operator==(&(ctx->functions).data[9]->name->name,&local_40);
          if (!bVar4) {
            __assert_fail("ctx.functions[function->function->functionIndex]->name->name == InplaceStr(\"int\")"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1188,
                          "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                         );
          }
          if (3 < (((VmInstruction *)value)->arguments).count) {
            pVVar8 = (((VmInstruction *)value)->arguments).data[3];
            if (((pVVar8->type).type != VM_TYPE_INT) || ((pVVar8->type).size != 4)) {
              __assert_fail("inst->arguments[3]->type == VmType::Int",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1189,
                            "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                           );
            }
LAB_00288864:
            (((VmInstruction *)value)->super_VmValue).hasSideEffects = false;
            anon_unknown.dwarf_233176::ReplaceValueUsersWith
                      (module,value,pVVar8,&module->peepholeOptimizations);
            return;
          }
        }
      }
    }
    break;
  case VM_INST_ADD:
    if ((((VmInstruction *)value)->arguments).count != 0) {
      bVar4 = IsConstantZero(*(((VmInstruction *)value)->arguments).data);
      uVar10 = (((VmInstruction *)value)->arguments).count;
      if (bVar4) {
LAB_00287eec:
        if (1 < uVar10) {
          pVVar5 = (VmConstant *)(((VmInstruction *)value)->arguments).data[1];
          goto LAB_00288640;
        }
      }
      else {
LAB_002885fa:
        if (1 < uVar10) {
          bVar4 = IsConstantZero((((VmInstruction *)value)->arguments).data[1]);
LAB_00288613:
          if (bVar4 == false) {
            return;
          }
          if ((((VmInstruction *)value)->arguments).count != 0) {
            pVVar5 = (VmConstant *)*(((VmInstruction *)value)->arguments).data;
            goto LAB_00288640;
          }
        }
      }
    }
    break;
  case VM_INST_SUB:
    if ((((VmInstruction *)value)->arguments).count != 0) {
      bVar4 = DoesConstantIntegerMatch(*(((VmInstruction *)value)->arguments).data,0);
      uVar10 = (((VmInstruction *)value)->arguments).count;
      if (!bVar4) goto LAB_002885fa;
      if (1 < uVar10) {
        pVVar5 = (VmConstant *)(((VmInstruction *)value)->arguments).data[1];
        cmd = VM_INST_NEG;
        pVVar7 = (VmConstant *)0x0;
        goto LAB_00287c00;
      }
    }
    break;
  case VM_INST_MUL:
    if ((((VmInstruction *)value)->arguments).count != 0) {
      bVar4 = IsConstantZero(*(((VmInstruction *)value)->arguments).data);
      if (bVar4) {
LAB_002885c0:
        VVar2 = (((VmInstruction *)value)->super_VmValue).type.type;
        uVar10 = (((VmInstruction *)value)->super_VmValue).type.size;
        if (uVar10 != 4 || VVar2 != VM_TYPE_INT) {
          if (uVar10 != 8 || VVar2 != VM_TYPE_LONG) {
            return;
          }
          pVVar5 = CreateConstantLong(module->allocator,
                                      (((VmInstruction *)value)->super_VmValue).source,0);
          goto LAB_00288640;
        }
LAB_002885d6:
        allocator = module->allocator;
        source = (((VmInstruction *)value)->super_VmValue).source;
        iVar11 = 0;
LAB_002885e3:
        pVVar5 = CreateConstantInt(allocator,source,iVar11);
LAB_00288640:
        anon_unknown.dwarf_233176::ReplaceValueUsersWith
                  (module,value,&pVVar5->super_VmValue,&module->peepholeOptimizations);
        return;
      }
      if (1 < (((VmInstruction *)value)->arguments).count) {
        bVar4 = IsConstantZero((((VmInstruction *)value)->arguments).data[1]);
        if (bVar4) goto LAB_002885c0;
        if ((((VmInstruction *)value)->arguments).count != 0) {
          bVar4 = IsConstantOne(*(((VmInstruction *)value)->arguments).data);
          uVar10 = (((VmInstruction *)value)->arguments).count;
          if (bVar4) goto LAB_00287eec;
          if (1 < uVar10) {
            bVar4 = IsConstantOne((((VmInstruction *)value)->arguments).data[1]);
            goto LAB_00288613;
          }
        }
      }
    }
    break;
  case VM_INST_LESS:
  case VM_INST_GREATER:
  case VM_INST_NOT_EQUAL:
    uVar10 = (((VmInstruction *)value)->arguments).count;
    if (uVar10 != 0) {
      ppVVar3 = (((VmInstruction *)value)->arguments).data;
      pVVar8 = *ppVVar3;
      VVar2 = (pVVar8->type).type;
      uVar1 = (pVVar8->type).size;
      if ((uVar1 != 4 || VVar2 != VM_TYPE_INT) && (uVar1 != 8 || VVar2 != VM_TYPE_LONG)) {
        return;
      }
      if (uVar10 != 1) {
        if (pVVar8 != ppVVar3[1]) {
          return;
        }
        goto LAB_002885d6;
      }
    }
    break;
  case VM_INST_LESS_EQUAL:
  case VM_INST_GREATER_EQUAL:
  case VM_INST_EQUAL:
    uVar10 = (((VmInstruction *)value)->arguments).count;
    if (uVar10 != 0) {
      ppVVar3 = (((VmInstruction *)value)->arguments).data;
      pVVar8 = *ppVVar3;
      VVar2 = (pVVar8->type).type;
      uVar1 = (pVVar8->type).size;
      if ((uVar1 != 4 || VVar2 != VM_TYPE_INT) && (uVar1 != 8 || VVar2 != VM_TYPE_LONG)) {
        return;
      }
      if (uVar10 != 1) {
        if (pVVar8 != ppVVar3[1]) {
          return;
        }
        allocator = module->allocator;
        source = (((VmInstruction *)value)->super_VmValue).source;
        iVar11 = 1;
        goto LAB_002885e3;
      }
    }
    break;
  case VM_INST_CONVERT_POINTER:
    uVar10 = (((VmInstruction *)value)->arguments).count;
    if (uVar10 != 0) {
      ppVVar3 = (((VmInstruction *)value)->arguments).data;
      pVVar8 = *ppVVar3;
      if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 2)) {
        pVVar8 = (VmValue *)0x0;
      }
      if (pVVar8 == (VmValue *)0x0) {
        return;
      }
      if (*(int *)&pVVar8[1]._vptr_VmValue != 0x49) {
        return;
      }
      VVar2 = pVVar8[1].type.type;
      if (VVar2 != VM_TYPE_VOID) {
        lVar12 = **(long **)&pVVar8[1].typeID;
        if ((lVar12 == 0) || (*(int *)(lVar12 + 8) != 2)) {
          lVar12 = 0;
        }
        if (uVar10 != 1) {
          pVVar9 = ppVVar3[1];
          if ((pVVar9 == (VmValue *)0x0) || (pVVar9->typeID != 2)) {
            pVVar9 = (VmValue *)0x0;
          }
          if (lVar12 == 0) {
            return;
          }
          if (pVVar9 == (VmValue *)0x0) {
            return;
          }
          if (*(int *)(lVar12 + 0x98) != 0x19) {
            return;
          }
          if (*(int *)&pVVar9[1]._vptr_VmValue != 0x19) {
            return;
          }
          if (*(int *)(lVar12 + 0xa8) != 0) {
            lVar12 = **(long **)(lVar12 + 0xa0);
            if ((lVar12 == 0) || (*(int *)(lVar12 + 8) != 1)) {
              lVar12 = 0;
            }
            if (pVVar9[1].type.type != VM_TYPE_VOID) {
              lVar13 = **(long **)&pVVar9[1].typeID;
              if ((lVar13 == 0) || (*(int *)(lVar13 + 8) != 1)) {
                lVar13 = 0;
              }
              if (lVar12 == 0) {
                return;
              }
              if (lVar13 == 0) {
                return;
              }
              if (*(int *)(lVar12 + 0x98) != *(int *)(lVar13 + 0x98)) {
                return;
              }
              if (VVar2 != VM_TYPE_INT) {
                pVVar5 = (VmConstant *)(*(long **)&pVVar8[1].typeID)[1];
                goto LAB_00288640;
              }
            }
          }
        }
      }
    }
    break;
  default:
    if (((VmInstruction *)value)->cmd != VM_INST_EXTRACT) {
      return;
    }
    uVar10 = (((VmInstruction *)value)->arguments).count;
    if (uVar10 != 0) {
      ppVVar3 = (((VmInstruction *)value)->arguments).data;
      pVVar8 = *ppVVar3;
      if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 2)) {
        pVVar8 = (VmValue *)0x0;
      }
      if (pVVar8 == (VmValue *)0x0) {
        return;
      }
      if (uVar10 != 1) {
        pVVar9 = ppVVar3[1];
        if ((pVVar9 == (VmValue *)0x0) || (pVVar9->typeID != 1)) {
          pVVar9 = (VmValue *)0x0;
        }
        if (pVVar8->typeID != 2) {
          return;
        }
        if (6 < *(uint *)&pVVar8[1]._vptr_VmValue) {
          return;
        }
        VVar2 = pVVar8[1].type.type;
        if ((VVar2 != VM_TYPE_VOID) && (VVar2 != VM_TYPE_INT)) {
          pVVar5 = (VmConstant *)**(long **)&pVVar8[1].typeID;
          lVar12 = (*(long **)&pVVar8[1].typeID)[1];
          if ((lVar12 == 0) || (*(int *)(lVar12 + 8) != 1)) {
            lVar12 = 0;
          }
          if ((pVVar5 == (VmConstant *)0x0) ||
             (pVVar7 = pVVar5, (pVVar5->super_VmValue).typeID != 1)) {
            pVVar7 = (VmConstant *)0x0;
          }
          if ((pVVar7 == (VmConstant *)0x0) || (pVVar7->container == (VariableData *)0x0)) {
            pVVar7 = CreateConstantInt(ctx->allocator,(SynBase *)0x0,
                                       *(int *)(lVar12 + 0x98) + *(int *)&pVVar9[1]._vptr_VmValue);
            pTVar6 = GetBaseType(ctx,(((VmInstruction *)value)->super_VmValue).type);
            cmd = anon_unknown.dwarf_233176::GetLoadInstruction(ctx,pTVar6);
          }
          else {
            if (*(int *)(lVar12 + 0x98) != 0) {
              __assert_fail("addressOffset->iValue == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1170,
                            "void RunPeepholeOptimizations(ExpressionContext &, VmModule *, VmValue *)"
                           );
            }
            pVVar5 = CreateConstantPointer
                               (module->allocator,(SynBase *)0x0,
                                *(int *)&pVVar9[1]._vptr_VmValue + pVVar7->iValue,pVVar7->container,
                                (pVVar7->super_VmValue).type.structType,true);
            pTVar6 = GetBaseType(ctx,(((VmInstruction *)value)->super_VmValue).type);
            cmd = anon_unknown.dwarf_233176::GetLoadInstruction(ctx,pTVar6);
            pVVar7 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
          }
          goto LAB_00287c00;
        }
      }
    }
  }
  __function = "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]";
LAB_002889eb:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,__function);
}

Assistant:

void RunPeepholeOptimizations(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunPeepholeOptimizations(ctx, module, curr);
			curr = next;
		}
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		VmInstruction *curr = block->firstInstruction;

		while(curr)
		{
			VmInstruction *next = curr->nextSibling;
			RunPeepholeOptimizations(ctx, module, curr);
			curr = next;
		}
	}
	else if(VmInstruction *inst = getType<VmInstruction>(value))
	{
		switch(inst->cmd)
		{
		case VM_INST_ADD:
			if(IsConstantZero(inst->arguments[0])) // 0 + x, all types
				ReplaceValueUsersWith(module, inst, inst->arguments[1], &module->peepholeOptimizations);
			else if(IsConstantZero(inst->arguments[1])) // x + 0, all types
				ReplaceValueUsersWith(module, inst, inst->arguments[0], &module->peepholeOptimizations);
			break;
		case VM_INST_SUB:
			if(DoesConstantIntegerMatch(inst->arguments[0], 0)) // 0 - x, integer types
				ChangeInstructionTo(module, inst, VM_INST_NEG, inst->arguments[1], NULL, NULL, NULL, NULL, &module->peepholeOptimizations);
			else if(IsConstantZero(inst->arguments[1])) // x - 0, all types
				ReplaceValueUsersWith(module, inst, inst->arguments[0], &module->peepholeOptimizations);
			break;
		case VM_INST_MUL:
			if(IsConstantZero(inst->arguments[0]) || IsConstantZero(inst->arguments[1])) // 0 * x or x * 0, all integer types (double can be NaN)
			{
				if(inst->type == VmType::Int)
					ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 0), &module->peepholeOptimizations);
				else if(inst->type == VmType::Long)
					ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, 0), &module->peepholeOptimizations);
			}
			else if(IsConstantOne(inst->arguments[0])) // 1 * x, all types
			{
				ReplaceValueUsersWith(module, inst, inst->arguments[1], &module->peepholeOptimizations);
			}
			else if(IsConstantOne(inst->arguments[1])) // x * 1, all types
			{
				ReplaceValueUsersWith(module, inst, inst->arguments[0], &module->peepholeOptimizations);
			}
			break;
		case VM_INST_INDEX_UNSIZED:
			// Try to replace unsized array index with an array index if the type[] is a construct expression
			if(VmInstruction *objectConstruct = getType<VmInstruction>(inst->arguments[1]))
			{
				if(objectConstruct->cmd == VM_INST_ARRAY && isType<VmConstant>(objectConstruct->arguments[1]))
					ChangeInstructionTo(module, inst, VM_INST_INDEX, objectConstruct->arguments[1], inst->arguments[0], objectConstruct->arguments[0], inst->arguments[2], NULL, &module->peepholeOptimizations);
			}
			break;
		case VM_INST_CONVERT_POINTER:
			// Try to replace with a pointer value if auto ref is a construct expression
			if(VmInstruction *objectConstruct = getType<VmInstruction>(inst->arguments[0]))
			{
				if(objectConstruct->cmd == VM_INST_CONSTRUCT)
				{
					VmInstruction *typeidConstruct = getType<VmInstruction>(objectConstruct->arguments[0]);

					VmInstruction *typeidConvert = getType<VmInstruction>(inst->arguments[1]);

					if(typeidConstruct && typeidConstruct->cmd == VM_INST_TYPE_ID && typeidConvert && typeidConvert->cmd == VM_INST_TYPE_ID)
					{
						VmConstant *typeIndexConstruct = getType<VmConstant>(typeidConstruct->arguments[0]);
						VmConstant *typeIndexConvert = getType<VmConstant>(typeidConvert->arguments[0]);

						if(typeIndexConstruct && typeIndexConvert && typeIndexConstruct->iValue == typeIndexConvert->iValue)
							ReplaceValueUsersWith(module, inst, objectConstruct->arguments[1], &module->peepholeOptimizations);
					}
				}
			}
			break;
		case VM_INST_LESS:
			if((inst->arguments[0]->type == VmType::Int || inst->arguments[0]->type == VmType::Long) && inst->arguments[0] == inst->arguments[1])
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 0), &module->peepholeOptimizations);
			break;
		case VM_INST_GREATER:
			if((inst->arguments[0]->type == VmType::Int || inst->arguments[0]->type == VmType::Long) && inst->arguments[0] == inst->arguments[1])
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 0), &module->peepholeOptimizations);
			break;
		case VM_INST_LESS_EQUAL:
			if((inst->arguments[0]->type == VmType::Int || inst->arguments[0]->type == VmType::Long) && inst->arguments[0] == inst->arguments[1])
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 1), &module->peepholeOptimizations);
			break;
		case VM_INST_GREATER_EQUAL:
			if((inst->arguments[0]->type == VmType::Int || inst->arguments[0]->type == VmType::Long) && inst->arguments[0] == inst->arguments[1])
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 1), &module->peepholeOptimizations);
			break;
		case VM_INST_EQUAL:
			if((inst->arguments[0]->type == VmType::Int || inst->arguments[0]->type == VmType::Long) && inst->arguments[0] == inst->arguments[1])
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 1), &module->peepholeOptimizations);
			break;
		case VM_INST_NOT_EQUAL:
			if((inst->arguments[0]->type == VmType::Int || inst->arguments[0]->type == VmType::Long) && inst->arguments[0] == inst->arguments[1])
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, 0), &module->peepholeOptimizations);
			break;
			// Try to place address offset into the load/store instruction
		case VM_INST_LOAD_BYTE:
		case VM_INST_LOAD_SHORT:
		case VM_INST_LOAD_INT:
		case VM_INST_LOAD_FLOAT:
		case VM_INST_LOAD_DOUBLE:
		case VM_INST_LOAD_LONG:
		case VM_INST_LOAD_STRUCT:
			if(VmInstruction *address = getType<VmInstruction>(inst->arguments[0]))
			{
				VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

				VmConstant *totalOffset = NULL;

				if(VmValue *ptr = TryGetMemberAccessPointerAndOffset(ctx, address, offset, &totalOffset))
					ChangeInstructionTo(module, inst, inst->cmd, ptr, totalOffset, NULL, NULL, NULL, &module->peepholeOptimizations);
			}
			break;
		case VM_INST_STORE_BYTE:
		case VM_INST_STORE_SHORT:
		case VM_INST_STORE_INT:
		case VM_INST_STORE_FLOAT:
		case VM_INST_STORE_DOUBLE:
		case VM_INST_STORE_LONG:
		case VM_INST_STORE_STRUCT:
			if(VmInstruction *address = getType<VmInstruction>(inst->arguments[0]))
			{
				VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

				VmConstant *totalOffset = NULL;

				if(VmValue *ptr = TryGetMemberAccessPointerAndOffset(ctx, address, offset, &totalOffset))
					ChangeInstructionTo(module, inst, inst->cmd, ptr, totalOffset, inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
			}
			break;
		case VM_INST_MEM_COPY:
			if(VmInstruction *address = getType<VmInstruction>(inst->arguments[0]))
			{
				VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

				VmConstant *totalOffset = NULL;

				if(VmValue *ptr = TryGetMemberAccessPointerAndOffset(ctx, address, offset, &totalOffset))
					ChangeInstructionTo(module, inst, inst->cmd, ptr, totalOffset, inst->arguments[2], inst->arguments[3], inst->arguments[4], &module->peepholeOptimizations);
			}

			if(VmInstruction *address = getType<VmInstruction>(inst->arguments[2]))
			{
				VmConstant *offset = getType<VmConstant>(inst->arguments[3]);

				VmConstant *totalOffset = NULL;

				if(VmValue *ptr = TryGetMemberAccessPointerAndOffset(ctx, address, offset, &totalOffset))
					ChangeInstructionTo(module, inst, inst->cmd, inst->arguments[0], inst->arguments[1], ptr, totalOffset, inst->arguments[4], &module->peepholeOptimizations);
			}
			break;
		case VM_INST_EXTRACT:
			if(VmInstruction *load = getType<VmInstruction>(inst->arguments[0]))
			{
				VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

				if(IsLoad(load))
				{
					VmValue *address = load->arguments[0];
					VmConstant *addressOffset = getType<VmConstant>(load->arguments[1]);

					VmConstant *addressAsConstant = getType<VmConstant>(address);

					if (addressAsConstant && addressAsConstant->container)
					{
						assert(addressOffset->iValue == 0);

						VmConstant *shiftedTarget = CreateConstantPointer(module->allocator, NULL, addressAsConstant->iValue + offset->iValue, addressAsConstant->container, addressAsConstant->type.structType, true);

						ChangeInstructionTo(module, inst, GetLoadInstruction(ctx, GetBaseType(ctx, inst->type)), shiftedTarget, CreateConstantInt(module->allocator, NULL, 0), NULL, NULL, NULL, &module->peepholeOptimizations);
					}
					else
					{
						VmConstant *totalOffset = CreateConstantInt(ctx.allocator, NULL, offset->iValue + addressOffset->iValue);

						ChangeInstructionTo(module, inst, GetLoadInstruction(ctx, GetBaseType(ctx, inst->type)), address, totalOffset, NULL, NULL, NULL, &module->peepholeOptimizations);
					}
				}
			}
			break;
		case VM_INST_CALL:
			if(inst->arguments[0]->type.type != VM_TYPE_FUNCTION_REF)
			{
				VmFunction *function = getType<VmFunction>(inst->arguments[1]);

				assert(function);

				if(function->function->functionIndex == 0x09)
				{
					assert(ctx.functions[function->function->functionIndex]->name->name == InplaceStr("int"));
					assert(inst->arguments[3]->type == VmType::Int);

					inst->hasSideEffects = false;

					ReplaceValueUsersWith(module, inst, inst->arguments[3], &module->peepholeOptimizations);
				}
				else if(function->function->functionIndex == 0x0a)
				{
					assert(ctx.functions[function->function->functionIndex]->name->name == InplaceStr("long"));
					assert(inst->arguments[3]->type == VmType::Long);

					inst->hasSideEffects = false;

					ReplaceValueUsersWith(module, inst, inst->arguments[3], &module->peepholeOptimizations);
				}
				else if(function->function->functionIndex == 0x0c)
				{
					assert(ctx.functions[function->function->functionIndex]->name->name == InplaceStr("double"));
					assert(inst->arguments[3]->type == VmType::Double);

					inst->hasSideEffects = false;

					ReplaceValueUsersWith(module, inst, inst->arguments[3], &module->peepholeOptimizations);
				}
			}
			break;
		case VM_INST_JUMP_NZ:
			if(VmInstruction *cond = getType<VmInstruction>(inst->arguments[0]))
			{
				if(cond->cmd == VM_INST_NOT_EQUAL && cond->arguments[0]->type == VmType::Int && cond->arguments[1]->type == VmType::Int)
				{
					if(IsConstantZero(cond->arguments[0]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_NZ, cond->arguments[1], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
					else if(IsConstantZero(cond->arguments[1]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_NZ, cond->arguments[0], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
				}
				else if(cond->cmd == VM_INST_EQUAL && cond->arguments[0]->type == VmType::Int && cond->arguments[1]->type == VmType::Int)
				{
					if(IsConstantZero(cond->arguments[0]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_Z, cond->arguments[1], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
					else if(IsConstantZero(cond->arguments[1]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_Z, cond->arguments[0], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
				}
			}
			break;
		case VM_INST_JUMP_Z:
			if(VmInstruction *cond = getType<VmInstruction>(inst->arguments[0]))
			{
				if(cond->cmd == VM_INST_NOT_EQUAL && cond->arguments[0]->type == VmType::Int && cond->arguments[1]->type == VmType::Int)
				{
					if(IsConstantZero(cond->arguments[0]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_Z, cond->arguments[1], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
					else if(IsConstantZero(cond->arguments[1]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_Z, cond->arguments[0], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
				}
				else if(cond->cmd == VM_INST_EQUAL && cond->arguments[0]->type == VmType::Int && cond->arguments[1]->type == VmType::Int)
				{
					if(IsConstantZero(cond->arguments[0]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_NZ, cond->arguments[1], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
					else if(IsConstantZero(cond->arguments[1]))
						ChangeInstructionTo(module, inst, VM_INST_JUMP_NZ, cond->arguments[0], inst->arguments[1], inst->arguments[2], NULL, NULL, &module->peepholeOptimizations);
				}
			}
			break;
		default:
			break;
		}
	}
}